

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_sum_max.hpp
# Opt level: O1

pair<std::ostream_iterator<int,_char,_std::char_traits<char>_>,_int> * __thiscall
burst::
partial_sum_max<std::istream_iterator<int,char,std::char_traits<char>,long>,std::ostream_iterator<int,char,std::char_traits<char>>,std::plus<void>,std::less<void>>
          (pair<std::ostream_iterator<int,_char,_std::char_traits<char>_>,_int>
           *__return_storage_ptr__,burst *this,long *first,
          ostream_iterator<int,_char,_std::char_traits<char>_> *last)

{
  int iVar1;
  undefined8 in_RAX;
  int iVar2;
  undefined8 uStack_38;
  
  if ((this[0xc] == *(burst *)((long)first + 0xc)) &&
     ((this[0xc] == (burst)0x0 || (*(long *)this == *first)))) {
    (__return_storage_ptr__->first)._M_stream = last->_M_stream;
    (__return_storage_ptr__->first)._M_string = last->_M_string;
    __return_storage_ptr__->second = 0;
  }
  else {
    iVar1 = *(int *)(this + 8);
    iVar2 = iVar1;
    uStack_38 = in_RAX;
    while( true ) {
      uStack_38 = CONCAT44(iVar1,(undefined4)uStack_38);
      std::ostream_iterator<int,_char,_std::char_traits<char>_>::operator=
                (last,(int *)((long)&uStack_38 + 4));
      std::istream_iterator<int,_char,_std::char_traits<char>,_long>::_M_read
                ((istream_iterator<int,_char,_std::char_traits<char>,_long> *)this);
      if ((this[0xc] == *(burst *)((long)first + 0xc)) &&
         ((this[0xc] == (burst)0x0 || (*(long *)this == *first)))) break;
      iVar1 = *(int *)(this + 8);
      if (iVar2 <= iVar1) {
        iVar2 = iVar1;
      }
      iVar1 = iVar1 + uStack_38._4_4_;
    }
    (__return_storage_ptr__->first)._M_stream = last->_M_stream;
    (__return_storage_ptr__->first)._M_string = last->_M_string;
    __return_storage_ptr__->second = iVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<OutputIterator, iterator_value_t<InputIterator>>
        partial_sum_max
        (
            InputIterator first,
            InputIterator last,
            OutputIterator result,
            BinaryFunction plus,
            BinaryPredicate less
        )
    {
        if (first != last)
        {
            auto sum = *first;
            auto max = sum;

            *result = sum;

            while (++first != last)
            {
                auto current = *first;
                if (less(max, current))
                {
                    max = current;
                }

                auto new_sum = plus(std::move(sum), std::move(current));
                sum = std::move(new_sum);

                ++result;
                *result = sum;
            }

            return {++result, max};
        }

        return {result, iterator_value_t<InputIterator>{}};
    }